

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_declared_member_location
          (CompilerGLSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t id;
  TypedID<(spirv_cross::Types)1> TVar2;
  SPIRType *pSVar3;
  SPIRType *block_type;
  bool strip_array_local;
  uint32_t mbr_idx_local;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    (&this->super_Compiler,(TypeID)TVar2.id,mbr_idx,DecorationLocation);
  if (bVar1) {
    TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
    this_local._4_4_ =
         Compiler::get_member_decoration(&this->super_Compiler,TVar2.id,mbr_idx,DecorationLocation);
  }
  else {
    this_local._4_4_ = get_accumulated_member_location(this,var,mbr_idx,strip_array);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::get_declared_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array) const
{
	auto &block_type = get<SPIRType>(var.basetype);
	if (has_member_decoration(block_type.self, mbr_idx, DecorationLocation))
		return get_member_decoration(block_type.self, mbr_idx, DecorationLocation);
	else
		return get_accumulated_member_location(var, mbr_idx, strip_array);
}